

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise3d.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise3D::forward
          (DeconvolutionDepthWise3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  int *piVar11;
  float *pfVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  long lVar20;
  long lVar21;
  undefined4 in_EAX;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  void *pvVar28;
  void *pvVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  void *pvVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  ulong uVar38;
  size_type __n;
  uint uVar39;
  void *pvVar40;
  bool bVar41;
  undefined4 uVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar48;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int iVar53;
  int iVar55;
  undefined1 auVar54 [16];
  int size;
  int size_1;
  vector<int,_std::allocator<int>_> _space_ofs;
  void *local_208;
  long local_200;
  long local_1e8;
  allocator_type local_1d9;
  ulong local_1d8;
  void *local_1d0;
  ulong local_1c8;
  long local_1c0;
  ulong local_1b8;
  void *local_1b0;
  undefined1 local_1a8 [16];
  Mat *local_198;
  void *local_190;
  long local_188;
  void *local_180;
  ulong local_178;
  long local_170;
  Mat local_168;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  ulong local_f8;
  ulong local_f0;
  void *local_e8;
  int local_dc;
  int local_d8;
  int local_d4;
  Option *local_d0;
  ulong local_c8;
  void *local_c0;
  ulong local_b8;
  void *local_b0;
  undefined1 local_a8 [16];
  void *local_98;
  long local_90;
  ulong local_88;
  long local_80;
  ulong local_78;
  long local_70;
  void *local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar26 = bottom_blob->w;
  iVar48 = bottom_blob->h;
  iVar32 = bottom_blob->d;
  iVar53 = this->kernel_w;
  iVar55 = this->dilation_w;
  local_108._8_8_ = local_108._0_8_;
  local_108._0_8_ = bottom_blob;
  sVar10 = bottom_blob->elemsize;
  iVar2 = this->stride_w;
  iVar3 = this->kernel_h;
  iVar4 = this->dilation_h;
  iVar5 = this->stride_h;
  iVar6 = this->kernel_d;
  iVar25 = this->dilation_d;
  iVar27 = this->stride_d;
  iVar31 = this->output_pad_right;
  iVar36 = this->output_pad_bottom;
  iVar7 = this->output_pad_behind;
  local_168.cstep = 0;
  local_168.data = (void *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.elemsize = 0;
  local_168.elempack = 0;
  local_168.allocator = (Allocator *)0x0;
  local_168.dims = 0;
  local_168.w = 0;
  local_168.h = 0;
  local_168.d = 0;
  local_168.c = 0;
  auVar44._0_4_ = -(uint)(0 < this->pad_left);
  auVar44._4_4_ = -(uint)(0 < this->pad_right);
  auVar44._8_4_ = -(uint)(0 < this->pad_top);
  auVar44._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar22 = movmskps(in_EAX,auVar44);
  lVar37 = 0x10;
  if (((((iVar22 == 0) && (this->pad_front < 1)) && (this->pad_behind < 1)) &&
      (((this->output_w < 1 || (this->output_h < 1)) || (this->output_d < 1)))) &&
     (lVar37 = 8, &local_168 != top_blob)) {
    piVar11 = top_blob->refcount;
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + 1;
      UNLOCK();
    }
    lVar37 = 8;
    local_168.data = top_blob->data;
    local_168.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_168.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_168.elemsize = top_blob->elemsize;
    local_168.elempack = top_blob->elempack;
    local_168.allocator = top_blob->allocator;
    uVar16 = top_blob->dims;
    uVar17 = top_blob->w;
    uVar18 = top_blob->h;
    uVar19 = top_blob->d;
    local_168.c = top_blob->c;
    local_168.cstep = top_blob->cstep;
    local_168.dims = uVar16;
    local_168.w = uVar17;
    local_168.h = uVar18;
    local_168.d = uVar19;
  }
  local_198 = top_blob;
  local_d0 = opt;
  Mat::create(&local_168,iVar31 + (iVar53 + -1) * iVar55 + (iVar26 + -1) * iVar2 + 1,
              iVar36 + 1 + (iVar3 + -1) * iVar4 + (iVar48 + -1) * iVar5,
              iVar7 + 1 + (iVar6 + -1) * iVar25 + (iVar32 + -1) * iVar27,this->num_output,sVar10,
              *(Allocator **)(&opt->lightmode + lVar37));
  iVar48 = local_168.c;
  iVar26 = local_168.h;
  iVar32 = -100;
  if ((local_168.data != (void *)0x0) &&
     (pvVar28 = (void *)(long)local_168.c, local_168.cstep * (long)pvVar28 != 0)) {
    iVar32 = this->kernel_w;
    iVar53 = this->kernel_h;
    iVar55 = this->kernel_d;
    local_1c0 = (long)this->stride_w;
    iVar2 = this->stride_h;
    iVar3 = this->stride_d;
    iVar4 = this->dilation_w;
    iVar5 = this->dilation_h;
    local_118._0_4_ = this->dilation_d;
    local_c8 = (ulong)(uint)this->group;
    local_1d8 = (ulong)(uint)this->activation_type;
    iVar6 = *(int *)(local_108._0_8_ + 0x38);
    local_1a8._0_4_ = local_168.w;
    uVar39 = iVar32 * iVar53 * iVar55;
    __n = (size_type)(int)uVar39;
    std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_1d9);
    auVar44 = local_118;
    if (0 < iVar55) {
      iVar25 = 0;
      iVar27 = 0;
      iVar31 = 0;
      do {
        if (0 < iVar53) {
          iVar36 = 0;
          do {
            if (0 < iVar32) {
              lVar37 = 0;
              do {
                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar25 + lVar37] = iVar27;
                iVar27 = iVar27 + iVar4;
                lVar37 = lVar37 + 1;
              } while (iVar32 != (int)lVar37);
              iVar25 = iVar25 + (int)lVar37;
            }
            iVar27 = iVar27 + (local_1a8._0_4_ * iVar5 - iVar4 * iVar32);
            iVar36 = iVar36 + 1;
          } while (iVar36 != iVar53);
        }
        iVar27 = iVar27 + (iVar26 * local_118._0_4_ - iVar5 * iVar53) * local_1a8._0_4_;
        iVar31 = iVar31 + 1;
      } while (iVar31 != iVar55);
    }
    iVar26 = (int)local_c8;
    if ((iVar6 == iVar26) && (iVar48 == iVar26)) {
      if (0 < iVar48) {
        local_188 = *(long *)local_108._0_8_;
        local_190 = (void *)(*(long *)(local_108._0_8_ + 0x10) * *(long *)(local_108._0_8_ + 0x40));
        pvVar40 = (this->weight_data).data;
        local_e8 = (this->bias_data).data;
        local_170 = local_168.cstep * local_168.elemsize;
        lVar34 = (long)local_168.h * (long)local_168.w;
        lVar37 = local_168.elemsize * lVar34;
        local_180 = local_168.data;
        local_1d0 = (void *)0x0;
        iVar26 = (int)((lVar37 + 0xfU & 0xfffffffffffffff0) / local_168.elemsize);
        if (local_168.dims == 4) {
          iVar26 = (int)lVar34;
        }
        local_1b8 = (ulong)(uint)(iVar26 * local_168.d);
        local_1c8 = (ulong)(uint)(local_168.h * local_168.w * local_168.d);
        local_1a8._0_8_ = lVar37 * iVar3;
        lVar34 = local_168.elemsize * (long)local_168.w;
        uVar23 = *(uint *)(local_108._0_8_ + 0x2c);
        lVar37 = local_1b8 - 1;
        uVar8 = *(uint *)(local_108._0_8_ + 0x30);
        uVar9 = *(uint *)(local_108._0_8_ + 0x34);
        local_a8[0] = (long)(this->bias_data).c * (this->bias_data).cstep == 0 ||
                      local_e8 == (void *)0x0;
        local_178 = (ulong)(iVar26 * local_168.d + 3U & 0xfffffffc);
        auVar51._8_4_ = (int)lVar37;
        auVar51._0_8_ = lVar37;
        auVar51._12_4_ = (int)((ulong)lVar37 >> 0x20);
        auVar51 = auVar51 ^ _DAT_00513610;
        local_1e8 = (long)local_168.data + 0xc;
        pvVar33 = local_168.data;
        auVar44 = _DAT_00513710;
        auVar52 = _DAT_00513720;
        auVar54 = _DAT_00513610;
        local_108 = auVar51;
        do {
          uVar42 = 0;
          if (local_a8[0] == '\0') {
            uVar42 = *(undefined4 *)((long)local_e8 + (long)local_1d0 * 4);
          }
          if (0 < (int)local_1b8) {
            uVar24 = 0;
            do {
              auVar45._8_4_ = (int)uVar24;
              auVar45._0_8_ = uVar24;
              auVar45._12_4_ = (int)(uVar24 >> 0x20);
              auVar46 = (auVar45 | auVar52) ^ auVar54;
              iVar48 = auVar51._0_4_;
              bVar41 = iVar48 < auVar46._0_4_;
              iVar26 = auVar46._4_4_;
              iVar32 = auVar51._4_4_;
              if ((bool)(~(iVar32 < iVar26 || iVar26 == iVar32 && bVar41) & 1)) {
                *(undefined4 *)(local_1e8 + -0xc + uVar24 * 4) = uVar42;
              }
              if (iVar32 >= iVar26 && (iVar26 != iVar32 || !bVar41)) {
                *(undefined4 *)(local_1e8 + -8 + uVar24 * 4) = uVar42;
              }
              auVar46 = (auVar45 | auVar44) ^ auVar54;
              iVar26 = auVar46._4_4_;
              if (iVar26 <= iVar32 && (iVar26 != iVar32 || auVar46._0_4_ <= iVar48)) {
                *(undefined4 *)(local_1e8 + -4 + uVar24 * 4) = uVar42;
                *(undefined4 *)(local_1e8 + uVar24 * 4) = uVar42;
              }
              uVar24 = uVar24 + 4;
            } while (local_178 != uVar24);
          }
          if (0 < (int)uVar9) {
            pvVar29 = (void *)(local_170 * (long)local_1d0 + (long)local_180);
            local_118._0_8_ = pvVar29;
            local_208 = (void *)0x0;
            do {
              if (0 < (int)uVar8) {
                uVar24 = 0;
                do {
                  if (0 < (int)uVar23) {
                    uVar38 = 0;
                    do {
                      if (0 < (int)uVar39) {
                        lVar37 = uVar38 * local_1c0 * 4 +
                                 lVar34 * iVar2 * uVar24 + local_1a8._0_8_ * (long)local_208;
                        fVar43 = *(float *)((long)local_190 * (long)local_1d0 + local_188 +
                                           (long)(int)(((int)local_208 * uVar8 + (int)uVar24) *
                                                       uVar23 + (int)uVar38) * 4);
                        uVar30 = 0;
                        do {
                          *(float *)((long)pvVar29 +
                                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start[uVar30] * 4 +
                                    lVar37) =
                               *(float *)((long)pvVar40 + uVar30 * 4) * fVar43 +
                               *(float *)((long)pvVar29 +
                                         (long)local_48.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start[uVar30] * 4 +
                                         lVar37);
                          uVar30 = uVar30 + 1;
                        } while (uVar39 != uVar30);
                      }
                      uVar38 = uVar38 + 1;
                    } while (uVar38 != uVar23);
                  }
                  uVar24 = uVar24 + 1;
                } while (uVar24 != uVar8);
              }
              local_208 = (void *)((long)local_208 + 1);
            } while (local_208 != (void *)(ulong)uVar9);
          }
          local_1b0 = pvVar33;
          if (0 < (int)local_1c8) {
            pfVar12 = (float *)(this->activation_params).data;
            uVar30 = 0;
            uVar24 = local_1d8;
            uVar38 = local_1c8;
            do {
              fVar43 = *(float *)((long)pvVar33 + uVar30 * 4);
              fVar50 = fVar43;
              switch((int)uVar24) {
              case 1:
                if (fVar43 <= 0.0) {
                  fVar50 = 0.0;
                }
                break;
              case 2:
                fVar50 = (float)(~-(uint)(0.0 < fVar43) & (uint)*pfVar12 |
                                -(uint)(0.0 < fVar43) & 0x3f800000) * fVar43;
                break;
              case 3:
                if (fVar43 <= *pfVar12) {
                  fVar43 = *pfVar12;
                }
                fVar50 = pfVar12[1];
                if (fVar43 <= pfVar12[1]) {
                  fVar50 = fVar43;
                }
                break;
              case 4:
                if (88.37626 <= fVar43) {
                  fVar43 = 88.37626;
                }
                fVar43 = expf((float)(-(uint)(fVar43 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar43 < -88.37626) & ((uint)fVar43 ^ auVar54._0_4_)))
                ;
                uVar24 = local_1d8;
                pvVar33 = local_1b0;
                uVar38 = local_1c8;
                auVar51 = local_108;
                auVar44 = _DAT_00513710;
                auVar52 = _DAT_00513720;
                auVar54 = _DAT_00513610;
                fVar50 = 1.0 / (fVar43 + 1.0);
                break;
              case 5:
                local_118 = ZEXT416((uint)fVar43);
                fVar43 = expf(fVar43);
                fVar43 = logf(fVar43 + 1.0);
                fVar43 = tanhf(fVar43);
                uVar24 = local_1d8;
                pvVar33 = local_1b0;
                uVar38 = local_1c8;
                auVar51 = local_108;
                auVar44 = _DAT_00513710;
                auVar52 = _DAT_00513720;
                auVar54 = _DAT_00513610;
                fVar50 = fVar43 * (float)local_118._0_4_;
                break;
              case 6:
                fVar1 = *pfVar12;
                fVar49 = (float)((uint)pfVar12[1] ^ auVar54._0_4_) / fVar1;
                fVar50 = 0.0;
                if ((fVar49 <= fVar43) && (fVar50 = fVar43, fVar43 <= fVar49 + 1.0 / fVar1)) {
                  fVar50 = (fVar1 * fVar43 + pfVar12[1]) * fVar43;
                }
              }
              *(float *)((long)pvVar33 + uVar30 * 4) = fVar50;
              uVar30 = uVar30 + 1;
            } while (uVar38 != uVar30);
          }
          local_1d0 = (void *)((long)local_1d0 + 1);
          local_1e8 = local_1e8 + local_170;
          pvVar40 = (void *)((long)pvVar40 + __n * 4);
          pvVar33 = (void *)((long)pvVar33 + local_170);
        } while (local_1d0 != pvVar28);
      }
    }
    else {
      uVar23 = iVar6 / iVar26;
      if (0 < iVar26) {
        local_190 = (void *)((long)iVar48 / (long)iVar26 & 0xffffffff);
        local_188 = local_168.cstep * local_168.elemsize;
        local_80 = (long)local_168.h * (long)local_168.w;
        local_88 = local_168.elemsize * local_80 + 0xf & 0xfffffffffffffff0;
        local_dc = local_168.dims;
        local_170 = local_168.elemsize * local_80 * (long)iVar3;
        local_d8 = local_168.d;
        local_1b8 = (ulong)(uint)(local_168.h * local_168.w * local_168.d);
        local_d4 = (int)((long)iVar48 / (long)iVar26);
        local_90 = (long)local_d4;
        local_78 = local_168.elemsize;
        lVar37 = (long)iVar2 * (long)local_168.w * local_168.elemsize;
        local_d4 = local_d4 * iVar32 * iVar53 * iVar55 * uVar23;
        local_70 = local_188 * local_90;
        local_60 = (long)(int)(uVar23 * uVar39) << 2;
        local_98 = (this->weight_data).data;
        local_b0 = (this->bias_data).data;
        uVar8 = *(uint *)(local_108._0_8_ + 0x2c);
        local_118._4_4_ = 0;
        local_118._0_4_ = *(uint *)(local_108._0_8_ + 0x30);
        local_118._8_8_ = auVar44._8_8_;
        local_1c8 = (ulong)*(uint *)(local_108._0_8_ + 0x34);
        local_b8 = (long)local_168.data + 0xc;
        local_f0 = 0;
        local_68 = local_168.data;
        local_c0 = local_168.data;
        local_f8 = 0;
        auVar44 = _DAT_00513710;
        auVar51 = _DAT_00513720;
        auVar52 = _DAT_00513610;
        do {
          if (0 < (int)local_190) {
            local_208 = (void *)((long)local_98 + (long)(int)local_f0 * 4);
            bVar41 = local_b0 != (void *)0x0;
            local_e8 = (void *)(local_f8 * local_90);
            iVar26 = (this->bias_data).c;
            sVar10 = (this->bias_data).cstep;
            iVar48 = (int)local_80;
            if (local_dc != 4) {
              iVar48 = (int)(local_88 / local_78);
            }
            local_50 = (ulong)(uint)(iVar48 * local_d8);
            iVar32 = (int)local_f8;
            local_58 = (ulong)(iVar48 * local_d8 + 3U & 0xfffffffc);
            lVar34 = local_50 - 1;
            auVar54._8_4_ = (int)lVar34;
            auVar54._0_8_ = lVar34;
            auVar54._12_4_ = (int)((ulong)lVar34 >> 0x20);
            auVar54 = auVar54 ^ auVar52;
            local_178 = local_b8;
            pvVar40 = (void *)0x0;
            pvVar28 = local_c0;
            local_a8 = auVar54;
            do {
              uVar42 = 0;
              if ((long)iVar26 * sVar10 != 0 && bVar41) {
                uVar42 = *(undefined4 *)((long)local_b0 + ((long)pvVar40 + (long)local_e8) * 4);
              }
              if (0 < (int)local_50) {
                uVar24 = 0;
                do {
                  auVar46._8_4_ = (int)uVar24;
                  auVar46._0_8_ = uVar24;
                  auVar46._12_4_ = (int)(uVar24 >> 0x20);
                  auVar47 = (auVar46 | auVar51) ^ auVar52;
                  iVar53 = auVar54._0_4_;
                  bVar15 = iVar53 < auVar47._0_4_;
                  iVar48 = auVar47._4_4_;
                  iVar55 = auVar54._4_4_;
                  if ((bool)(~(iVar55 < iVar48 || iVar48 == iVar55 && bVar15) & 1)) {
                    *(undefined4 *)((local_178 - 0xc) + uVar24 * 4) = uVar42;
                  }
                  if (iVar55 >= iVar48 && (iVar48 != iVar55 || !bVar15)) {
                    *(undefined4 *)((local_178 - 8) + uVar24 * 4) = uVar42;
                  }
                  auVar46 = (auVar46 | auVar44) ^ auVar52;
                  iVar48 = auVar46._4_4_;
                  if (iVar48 <= iVar55 && (iVar48 != iVar55 || auVar46._0_4_ <= iVar53)) {
                    *(undefined4 *)((local_178 - 4) + uVar24 * 4) = uVar42;
                    *(undefined4 *)(local_178 + uVar24 * 4) = uVar42;
                  }
                  uVar24 = uVar24 + 4;
                } while (local_58 != uVar24);
              }
              if (0 < (int)local_1c8) {
                local_1d0 = (void *)(((long)pvVar40 + (long)local_e8) * local_188 + (long)local_68);
                auVar47._8_8_ = 0;
                auVar47._0_8_ = local_1a8._8_8_;
                local_1a8 = auVar47 << 0x40;
                do {
                  if (0 < (int)local_118._0_4_) {
                    local_1b0 = (void *)(local_170 * local_1a8._0_8_ + (long)local_1d0);
                    local_200 = 0;
                    do {
                      if (0 < (int)uVar8) {
                        lVar21 = *(long *)(local_108._0_8_ + 0x30);
                        lVar34 = *(long *)(local_108._0_8_ + 0x10);
                        lVar13 = *(long *)(local_108._0_8_ + 0x40);
                        lVar35 = *(int *)(local_108._0_8_ + 0x2c) * lVar34;
                        lVar14 = *(long *)local_108._0_8_;
                        uVar24 = 0;
                        do {
                          if (0 < (int)uVar23) {
                            lVar20 = uVar24 * local_1c0 * 4 + lVar37 * local_200;
                            uVar38 = 0;
                            pvVar33 = local_208;
                            do {
                              if (0 < (int)uVar39) {
                                fVar43 = *(float *)(lVar35 * local_200 +
                                                    (long)(int)lVar21 * local_1a8._0_8_ * lVar35 +
                                                    lVar14 + uVar24 * 4 +
                                                   (uVar38 + uVar23 * iVar32) * lVar13 * lVar34);
                                uVar30 = 0;
                                do {
                                  *(float *)((long)local_1b0 +
                                            (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar30] *
                                            4 + lVar20) =
                                       *(float *)((long)pvVar33 + uVar30 * 4) * fVar43 +
                                       *(float *)((long)local_1b0 +
                                                 (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar30] *
                                                 4 + lVar20);
                                  uVar30 = uVar30 + 1;
                                } while (uVar39 != uVar30);
                              }
                              uVar38 = uVar38 + 1;
                              pvVar33 = (void *)((long)pvVar33 + __n * 4);
                            } while (uVar38 != uVar23);
                          }
                          uVar24 = uVar24 + 1;
                        } while (uVar24 != uVar8);
                      }
                      local_200 = local_200 + 1;
                    } while (local_200 != local_118._0_8_);
                  }
                  uVar24 = local_1a8._0_8_ + 1;
                  local_1a8._0_8_ = uVar24;
                } while (uVar24 != local_1c8);
              }
              local_180 = pvVar40;
              if (0 < (int)local_1b8) {
                pfVar12 = (float *)(this->activation_params).data;
                uVar30 = 0;
                uVar24 = local_1d8;
                uVar38 = local_1b8;
                do {
                  fVar43 = *(float *)((long)pvVar28 + uVar30 * 4);
                  fVar50 = fVar43;
                  switch((int)uVar24) {
                  case 1:
                    if (fVar43 <= 0.0) {
                      fVar50 = 0.0;
                    }
                    break;
                  case 2:
                    fVar50 = (float)(~-(uint)(0.0 < fVar43) & (uint)*pfVar12 |
                                    -(uint)(0.0 < fVar43) & 0x3f800000) * fVar43;
                    break;
                  case 3:
                    if (fVar43 <= *pfVar12) {
                      fVar43 = *pfVar12;
                    }
                    fVar50 = pfVar12[1];
                    if (fVar43 <= pfVar12[1]) {
                      fVar50 = fVar43;
                    }
                    break;
                  case 4:
                    if (88.37626 <= fVar43) {
                      fVar43 = 88.37626;
                    }
                    fVar43 = expf((float)(-(uint)(fVar43 < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(fVar43 < -88.37626) &
                                         ((uint)fVar43 ^ auVar52._0_4_)));
                    uVar24 = local_1d8;
                    uVar38 = local_1b8;
                    auVar44 = _DAT_00513710;
                    auVar51 = _DAT_00513720;
                    auVar52 = _DAT_00513610;
                    auVar54 = local_a8;
                    fVar50 = 1.0 / (fVar43 + 1.0);
                    break;
                  case 5:
                    local_1a8 = ZEXT416((uint)fVar43);
                    fVar43 = expf(fVar43);
                    fVar43 = logf(fVar43 + 1.0);
                    fVar43 = tanhf(fVar43);
                    uVar24 = local_1d8;
                    uVar38 = local_1b8;
                    auVar44 = _DAT_00513710;
                    auVar51 = _DAT_00513720;
                    auVar52 = _DAT_00513610;
                    auVar54 = local_a8;
                    fVar50 = fVar43 * (float)local_1a8._0_4_;
                    break;
                  case 6:
                    fVar1 = *pfVar12;
                    fVar49 = (float)((uint)pfVar12[1] ^ auVar52._0_4_) / fVar1;
                    fVar50 = 0.0;
                    if ((fVar49 <= fVar43) && (fVar50 = fVar43, fVar43 <= fVar49 + 1.0 / fVar1)) {
                      fVar50 = (fVar1 * fVar43 + pfVar12[1]) * fVar43;
                    }
                  }
                  *(float *)((long)pvVar28 + uVar30 * 4) = fVar50;
                  uVar30 = uVar30 + 1;
                } while (uVar38 != uVar30);
              }
              pvVar40 = (void *)((long)local_180 + 1);
              local_178 = local_178 + local_188;
              local_208 = (void *)((long)local_208 + local_60);
              pvVar28 = (void *)((long)pvVar28 + local_188);
            } while (pvVar40 != local_190);
          }
          local_f8 = local_f8 + 1;
          local_b8 = local_b8 + local_70;
          local_f0 = (ulong)(uint)((int)local_f0 + local_d4);
          local_c0 = (void *)((long)local_c0 + local_70);
        } while (local_f8 != local_c8);
      }
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    cut_padding(this,&local_168,local_198,local_d0);
    if ((local_198->data == (void *)0x0) || (iVar32 = 0, (long)local_198->c * local_198->cstep == 0)
       ) {
      iVar32 = -100;
    }
  }
  piVar11 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if (local_168.data != (void *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar32;
}

Assistant:

int DeconvolutionDepthWise3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extent_d = dilation_d * (kernel_d - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int outd = (d - 1) * stride_d + kernel_extent_d + output_pad_behind;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || pad_front > 0 || pad_behind > 0 || (output_w > 0 && output_h > 0 && output_d > 0))
    {
        top_blob_bordered.create(outw, outh, outd, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise3d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, kernel_d, stride_w, stride_h, stride_d, dilation_w, dilation_h, dilation_d, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}